

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

int nni_ctx_open(nni_ctx **ctxp,nni_sock *sock)

{
  _Bool _Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  _func_void_void_ptr *p_Var3;
  _func_void_void_ptr_nni_aio_ptr *p_Var4;
  _func_void_void_ptr_nni_aio_ptr *p_Var5;
  nni_option *pnVar6;
  nni_duration nVar7;
  int iVar8;
  nni_ctx *ctx;
  size_t sz;
  
  if ((sock->s_ctx_ops).ctx_init == (_func_void_void_ptr_void_ptr *)0x0) {
    iVar8 = 9;
  }
  else {
    sz = (sock->s_ctx_ops).ctx_size + 0x70;
    ctx = (nni_ctx *)nni_zalloc(sz);
    if (ctx == (nni_ctx *)0x0) {
      iVar8 = 2;
    }
    else {
      ctx->c_size = sz;
      ctx->c_data = ctx + 1;
      ctx->c_closed = false;
      ctx->c_ref = 1;
      ctx->c_sock = sock;
      p_Var2 = (sock->s_ctx_ops).ctx_init;
      p_Var3 = (sock->s_ctx_ops).ctx_fini;
      p_Var4 = (sock->s_ctx_ops).ctx_recv;
      p_Var5 = (sock->s_ctx_ops).ctx_send;
      pnVar6 = (sock->s_ctx_ops).ctx_options;
      (ctx->c_ops).ctx_size = (sock->s_ctx_ops).ctx_size;
      (ctx->c_ops).ctx_init = p_Var2;
      (ctx->c_ops).ctx_fini = p_Var3;
      (ctx->c_ops).ctx_recv = p_Var4;
      (ctx->c_ops).ctx_send = p_Var5;
      (ctx->c_ops).ctx_options = pnVar6;
      nVar7 = sock->s_rcvtimeo;
      ctx->c_sndtimeo = sock->s_sndtimeo;
      ctx->c_rcvtimeo = nVar7;
      nni_mtx_lock(&sock_lk);
      if (sock->s_closed == true) {
        nni_mtx_unlock(&sock_lk);
        nni_free(ctx,ctx->c_size);
      }
      else {
        iVar8 = nni_id_alloc32(&ctx_ids,&ctx->c_id,ctx);
        if (iVar8 != 0) {
          nni_mtx_unlock(&sock_lk);
          nni_free(ctx,ctx->c_size);
          return iVar8;
        }
        (*(sock->s_ctx_ops).ctx_init)(ctx->c_data,sock->s_data);
        nni_list_append(&sock->s_ctxs,ctx);
        nni_mtx_unlock(&sock_lk);
        nni_mtx_lock(&sock->s_mx);
        _Var1 = sock->s_closing;
        nni_mtx_unlock(&sock->s_mx);
        if (_Var1 != true) {
          *ctxp = ctx;
          return 0;
        }
        nni_ctx_rele(ctx);
      }
      iVar8 = 7;
    }
  }
  return iVar8;
}

Assistant:

int
nni_ctx_open(nni_ctx **ctxp, nni_sock *sock)
{
	nni_ctx *ctx;
	int      rv;
	size_t   sz;

	if (sock->s_ctx_ops.ctx_init == NULL) {
		return (NNG_ENOTSUP);
	}

	sz = NNI_ALIGN_UP(sizeof(*ctx)) + sock->s_ctx_ops.ctx_size;
	if ((ctx = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}
	ctx->c_size     = sz;
	ctx->c_data     = ctx + 1;
	ctx->c_closed   = false;
	ctx->c_ref      = 1; // Caller implicitly gets a reference.
	ctx->c_sock     = sock;
	ctx->c_ops      = sock->s_ctx_ops;
	ctx->c_rcvtimeo = sock->s_rcvtimeo;
	ctx->c_sndtimeo = sock->s_sndtimeo;

	nni_mtx_lock(&sock_lk);
	if (sock->s_closed) {
		nni_mtx_unlock(&sock_lk);
		nni_free(ctx, ctx->c_size);
		return (NNG_ECLOSED);
	}
	if ((rv = nni_id_alloc32(&ctx_ids, &ctx->c_id, ctx)) != 0) {
		nni_mtx_unlock(&sock_lk);
		nni_free(ctx, ctx->c_size);
		return (rv);
	}

	sock->s_ctx_ops.ctx_init(ctx->c_data, sock->s_data);

	nni_list_append(&sock->s_ctxs, ctx);
	nni_mtx_unlock(&sock_lk);

	// Paranoia, fixing a possible race in close.  Don't let us
	// give back a context if the socket is being shutdown (it
	// might not have reached the "closed" state yet.)
	nni_mtx_lock(&sock->s_mx);
	if (sock->s_closing) {
		nni_mtx_unlock(&sock->s_mx);
		nni_ctx_rele(ctx);
		return (NNG_ECLOSED);
	}
	nni_mtx_unlock(&sock->s_mx);
	*ctxp = ctx;

	return (0);
}